

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O3

FIOBJ fiobj_str_move(char *str,size_t len,size_t capacity)

{
  long lVar1;
  undefined1 *puVar2;
  long lVar3;
  long *in_FS_OFFSET;
  fio_str_info_s fStack_38;
  code *pcStack_20;
  
  pcStack_20 = (code *)0x144444;
  puVar2 = (undefined1 *)fio_malloc(0x40);
  if (puVar2 != (undefined1 *)0x0) {
    *puVar2 = 0x28;
    *(undefined4 *)(puVar2 + 4) = 1;
    *(undefined8 *)(puVar2 + 8) = 0;
    *(undefined8 *)(puVar2 + 0x10) = 0;
    *(undefined8 *)(puVar2 + 0x18) = 0;
    *(size_t *)(puVar2 + 0x20) = capacity;
    *(size_t *)(puVar2 + 0x28) = len;
    *(code **)(puVar2 + 0x30) = fio_free;
    *(char **)(puVar2 + 0x38) = str;
    return (ulong)puVar2 | 2;
  }
  pcStack_20 = fiobj_str_tmp;
  fiobj_str_move_cold_1();
  lVar1 = *in_FS_OFFSET;
  *(undefined1 *)((long)in_FS_OFFSET + -0x2e7) = 0;
  if (((char)in_FS_OFFSET[-0x5d] == '\0') &&
     (puVar2 = (undefined1 *)in_FS_OFFSET[-0x58], puVar2 != (undefined1 *)0x0)) {
    if (in_FS_OFFSET[-0x5b] == 0) {
      lVar3 = 0;
      if (in_FS_OFFSET[-0x59] == 0) {
        lVar3 = in_FS_OFFSET[-0x5a];
      }
      in_FS_OFFSET[-0x5a] = lVar3;
      pcStack_20 = (code *)str;
      fio_str_capa_assert(&fStack_38,(fio_str_s_conflict *)(lVar1 + -0x2e8),0);
      puVar2 = (undefined1 *)in_FS_OFFSET[-0x58];
    }
    in_FS_OFFSET[-0x5a] = 0;
  }
  else {
    *(undefined1 *)(in_FS_OFFSET + -0x5d) = 1;
    puVar2 = (undefined1 *)(lVar1 + -0x2e6);
  }
  *puVar2 = 0;
  return lVar1 - 0x2f8U | 2;
}

Assistant:

FIOBJ fiobj_str_move(char *str, size_t len, size_t capacity) {
  fiobj_str_s *s = fio_malloc(sizeof(*s));
  if (!s) {
    perror("ERROR: fiobj string couldn't allocate memory");
    exit(errno);
  }
  *s = (fiobj_str_s){
      .head =
          {
              .ref = 1,
              .type = FIOBJ_T_STRING,
          },
      .str = FIO_STR_INIT_EXISTING(str, len, capacity),
  };
  return ((uintptr_t)s | FIOBJECT_STRING_FLAG);
}